

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

bool __thiscall AmpIO::DallasReadMemory(AmpIO *this,unsigned_short addr,uchar *data,uint nbytes)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 in_RAX;
  uint uVar3;
  ulong uVar4;
  uchar *data_00;
  uint32_t status;
  
  status._0_2_ = (short)((ulong)in_RAX >> 0x20);
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if ((((6 < uVar2) && (uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this), uVar2 != 0x64524131))
      && (bVar1 = DallasWriteControl(this,(uint)addr << 0x10 | 2), bVar1)) &&
     ((bVar1 = DallasWaitIdle(this), bVar1 && (bVar1 = DallasReadStatus(this,&status), bVar1)))) {
    uVar3 = 0x100;
    if (nbytes < 0x100) {
      uVar3 = nbytes;
    }
    bVar1 = DallasReadBlock(this,data,uVar3);
    if (bVar1) {
      data_00 = data + uVar3;
      for (uVar3 = nbytes - uVar3; uVar3 != 0; uVar3 = uVar3 - (uint)uVar4) {
        bVar1 = DallasWriteControl(this,3);
        if (!bVar1) {
          return false;
        }
        bVar1 = DallasWaitIdle(this);
        if (!bVar1) {
          return false;
        }
        uVar4 = 0x100;
        if (uVar3 < 0x100) {
          uVar4 = (ulong)uVar3;
        }
        bVar1 = DallasReadBlock(this,data_00,(uint)uVar4);
        if (!bVar1) {
          return false;
        }
        data_00 = data_00 + uVar4;
      }
      if ((-1 < (short)status) ||
         ((bVar1 = DallasWriteControl(this,9), bVar1 && (bVar1 = DallasWaitIdle(this), bVar1)))) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool AmpIO::DallasReadMemory(unsigned short addr, unsigned char *data, unsigned int nbytes)
{
    if (GetFirmwareVersion() < 7) return false;
    if (GetHardwareVersion() == dRA1_String) return false;

    uint32_t status;
    uint32_t ctrl = (addr<<16)|2;
    if (!DallasWriteControl(ctrl)) return false;
    if (!DallasWaitIdle()) return false;
    if (!DallasReadStatus(status)) return false;

    // Automatically detect interface in use
    bool useDS2480B = (status & 0x00008000) == 0x00008000;

    unsigned char *ptr = data;
    // Read first block of data (up to 256 bytes)
    unsigned int nb = (nbytes>256) ? 256 : nbytes;
    if (!DallasReadBlock(ptr, nb)) return false;
    ptr += nb;
    nbytes -= nb;
    // Read additional blocks of data if necessary
    while (nbytes > 0) {
        // 0x03 indicates reg_wdata[1:0] == 11 in firmware DS2505.v
        if (!DallasWriteControl(0x03)) return false;
        if (!DallasWaitIdle()) return false;
        nb = (nbytes>256) ? 256 : nbytes;
        if (!DallasReadBlock(ptr, nb)) return false;
        ptr += nb;
        nbytes -= nb;
    }
    // End all blocks reading for DS2480B interface
    if (nbytes <= 0 && useDS2480B) {
        // 0x09 indicates reg_wdata[3] == 1 && reg_wdata[1:0] == 01 in firmware DS2505.v
        if (!DallasWriteControl(0x09)) return false;
        if (!DallasWaitIdle()) return false;
    }
    return true;
}